

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RemapStructBindData::Copy(RemapStructBindData *this)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  make_uniq<duckdb::RemapStructBindData,duckdb::vector<duckdb::RemapColumnInfo,true>const&>
            ((vector<duckdb::RemapColumnInfo,_true> *)this);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::RemapStructBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this_00._M_head_impl,
             (unique_ptr<duckdb::RemapStructBindData,_std::default_delete<duckdb::RemapStructBindData>_>
              *)in_RDI._M_head_impl);
  unique_ptr<duckdb::RemapStructBindData,_std::default_delete<duckdb::RemapStructBindData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::RemapStructBindData,_std::default_delete<duckdb::RemapStructBindData>,_true>
               *)0x13d96e5);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<RemapStructBindData>(remap_info);
	}